

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

void icu_63::number::impl::enum_to_stem_string::unitWidth(UNumberUnitWidth value,UnicodeString *sb)

{
  ConstChar16Ptr local_78;
  ConstChar16Ptr local_70;
  ConstChar16Ptr local_68;
  ConstChar16Ptr local_60;
  ConstChar16Ptr local_58 [11];
  
  switch(value) {
  case UNUM_UNIT_WIDTH_NARROW:
    local_58[0].p_ = L"unit-width-narrow";
    UnicodeString::append(sb,local_58,-1);
    break;
  case UNUM_UNIT_WIDTH_SHORT:
    local_60.p_ = L"unit-width-short";
    UnicodeString::append(sb,&local_60,-1);
    break;
  case UNUM_UNIT_WIDTH_FULL_NAME:
    local_68.p_ = L"unit-width-full-name";
    UnicodeString::append(sb,&local_68,-1);
    break;
  case UNUM_UNIT_WIDTH_ISO_CODE:
    local_70.p_ = L"unit-width-iso-code";
    UnicodeString::append(sb,&local_70,-1);
    break;
  case UNUM_UNIT_WIDTH_HIDDEN:
    local_78.p_ = L"unit-width-hidden";
    UnicodeString::append(sb,&local_78,-1);
  }
  return;
}

Assistant:

void enum_to_stem_string::unitWidth(UNumberUnitWidth value, UnicodeString& sb) {
    switch (value) {
        case UNUM_UNIT_WIDTH_NARROW:
            sb.append(u"unit-width-narrow", -1);
            break;
        case UNUM_UNIT_WIDTH_SHORT:
            sb.append(u"unit-width-short", -1);
            break;
        case UNUM_UNIT_WIDTH_FULL_NAME:
            sb.append(u"unit-width-full-name", -1);
            break;
        case UNUM_UNIT_WIDTH_ISO_CODE:
            sb.append(u"unit-width-iso-code", -1);
            break;
        case UNUM_UNIT_WIDTH_HIDDEN:
            sb.append(u"unit-width-hidden", -1);
            break;
        default:
            U_ASSERT(false);
    }
}